

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t archive_read_disk_set_gname_lookup
                  (archive *_a,void *private_data,_func_char_ptr_void_ptr_la_int64_t *lookup_gname,
                  _func_void_void_ptr *cleanup_gname)

{
  int iVar1;
  wchar_t magic_test;
  archive_read_disk *a;
  _func_void_void_ptr *cleanup_gname_local;
  _func_char_ptr_void_ptr_la_int64_t *lookup_gname_local;
  void *private_data_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_set_gname_lookup");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if ((_a[1].error_string.buffer_length != 0) && (_a[1].current_code != (char *)0x0)) {
      (*(code *)_a[1].error_string.buffer_length)(_a[1].current_code);
    }
    _a[1].error_string.length = (size_t)lookup_gname;
    _a[1].error_string.buffer_length = (size_t)cleanup_gname;
    _a[1].current_code = (char *)private_data;
    _a_local._4_4_ = L'\0';
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_disk_set_gname_lookup(struct archive *_a,
    void *private_data,
    const char * (*lookup_gname)(void *private, la_int64_t gid),
    void (*cleanup_gname)(void *private))
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_set_gname_lookup");

	if (a->cleanup_gname != NULL && a->lookup_gname_data != NULL)
		(a->cleanup_gname)(a->lookup_gname_data);

	a->lookup_gname = lookup_gname;
	a->cleanup_gname = cleanup_gname;
	a->lookup_gname_data = private_data;
	return (ARCHIVE_OK);
}